

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this,BoolLitExpr *node)

{
  BuilderContext *this_00;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<mocker::ir::Addr> local_48;
  ulong local_30;
  
  this_00 = this->ctx;
  local_30 = (ulong)node->val;
  std::make_shared<mocker::ir::IntLiteral,long>((long *)&local_58);
  local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_50._M_pi;
  local_58 = (element_type *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BuilderContext::setExprAddr(this_00,(NodeID)node,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  BuilderContext::markExprTrivial(this->ctx,(Expression *)node);
  BuilderContext::checkLogicalExpr(this->ctx,(Expression *)node);
  return;
}

Assistant:

void Builder::operator()(const ast::BoolLitExpr &node) const {
  ctx.setExprAddr(node.getID(),
                  std::make_shared<IntLiteral>((Integer)node.val));
  ctx.markExprTrivial(node);
  ctx.checkLogicalExpr(node);
}